

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O1

int wallet::CalculateMaximumSignedInputSize
              (CTxOut *txout,CWallet *wallet,CCoinControl *coin_control)

{
  COutPoint outpoint;
  WalletStorage provider_00;
  bool can_grind_r;
  int iVar1;
  long in_FS_OFFSET;
  unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_> provider;
  WalletStorage local_60;
  Notifications local_58;
  pointer puStack_50;
  pointer local_48;
  pointer puStack_40;
  uint32_t local_38;
  __atomic_float<double> local_28;
  
  local_28._M_fp = *(double *)(in_FS_OFFSET + 0x28);
  CWallet::GetSolvingProvider((CWallet *)&stack0xffffffffffffffa0,(CScript *)wallet);
  provider_00._vptr_WalletStorage = local_60._vptr_WalletStorage;
  local_48 = (pointer)0x0;
  puStack_40 = (pointer)0x0;
  local_58._vptr_Notifications = (_func_int **)0x0;
  puStack_50 = (pointer)0x0;
  local_38 = 0xffffffff;
  can_grind_r = CWallet::CanGrindR(wallet);
  outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ = puStack_50;
  outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = local_58._vptr_Notifications
  ;
  outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ = local_48;
  outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = puStack_40;
  outpoint.n = local_38;
  iVar1 = CalculateMaximumSignedInputSize
                    (txout,outpoint,(SigningProvider *)provider_00._vptr_WalletStorage,can_grind_r,
                     coin_control);
  if ((SigningProvider *)local_60._vptr_WalletStorage != (SigningProvider *)0x0) {
    (**(_func_int **)((long)*local_60._vptr_WalletStorage + 8))();
  }
  if (*(double *)(in_FS_OFFSET + 0x28) == local_28._M_fp) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int CalculateMaximumSignedInputSize(const CTxOut& txout, const CWallet* wallet, const CCoinControl* coin_control)
{
    const std::unique_ptr<SigningProvider> provider = wallet->GetSolvingProvider(txout.scriptPubKey);
    return CalculateMaximumSignedInputSize(txout, COutPoint(), provider.get(), wallet->CanGrindR(), coin_control);
}